

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rga.cpp
# Opt level: O0

MPP_RET config_rga_image(RgaImg *img,MppFrame frame)

{
  RK_U16 RVar1;
  RK_U16 RVar2;
  RK_U16 RVar3;
  RK_U16 RVar4;
  MppFrameFormat fmt_00;
  RgaFormat RVar5;
  int iVar6;
  undefined8 uVar7;
  RK_S32 fd;
  RK_U32 v_str;
  RK_U32 h_str;
  RK_U32 height;
  RK_U32 width;
  MppBuffer buf;
  RgaFormat fmt;
  MppFrame frame_local;
  RgaImg *img_local;
  
  fmt_00 = mpp_frame_get_fmt(frame);
  RVar5 = rga_fmt_map(fmt_00);
  uVar7 = mpp_frame_get_buffer(frame);
  RVar1 = mpp_frame_get_width(frame);
  RVar2 = mpp_frame_get_height(frame);
  RVar3 = mpp_frame_get_hor_stride(frame);
  RVar4 = mpp_frame_get_ver_stride(frame);
  iVar6 = mpp_buffer_get_fd_with_caller(uVar7);
  if ((int)RVar5 < 0x14) {
    memset(img,0,0x30);
    img->yrgb_addr = (long)iVar6;
    img->format = RVar5;
    img->act_w = RVar1;
    img->act_h = RVar2;
    img->vir_w = RVar3;
    img->vir_h = RVar4;
    img_local._4_4_ = MPP_OK;
  }
  else {
    _mpp_log_l(2,0,"invalid input format for rga process %d\n",0,RVar5);
    img_local._4_4_ = MPP_NOK;
  }
  return img_local._4_4_;
}

Assistant:

static MPP_RET config_rga_image(RgaImg *img, MppFrame frame)
{
    RgaFormat fmt = rga_fmt_map(mpp_frame_get_fmt(frame));
    MppBuffer buf = mpp_frame_get_buffer(frame);
    RK_U32 width  = mpp_frame_get_width(frame);
    RK_U32 height = mpp_frame_get_height(frame);
    RK_U32 h_str  = mpp_frame_get_hor_stride(frame);
    RK_U32 v_str  = mpp_frame_get_ver_stride(frame);
    RK_S32 fd = mpp_buffer_get_fd(buf);

    if (fmt >= RGA_FMT_BUTT) {
        mpp_err("invalid input format for rga process %d\n", fmt);
        return MPP_NOK;
    }

    memset(img, 0, sizeof(RgaImg));
    img->yrgb_addr = fd;
    img->format = (RK_U32)fmt;
    img->act_w = width;
    img->act_h = height;
    img->vir_w = h_str;
    img->vir_h = v_str;

    return MPP_OK;
}